

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O2

void __thiscall wasm::Wasm2JSBuilder::addMemoryFuncs(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Value *this_00;
  pointer puVar1;
  Memory *pMVar2;
  size_t sVar3;
  Ref ast_00;
  Ref *pRVar4;
  Ref RVar5;
  Ref this_01;
  Ref RVar6;
  char *in_RCX;
  char *extraout_RDX;
  Ref in_R8;
  IString name;
  IString name_00;
  IString key;
  IString op;
  IString local_50;
  Ref local_40;
  Ref memorySizeFunc;
  
  name.str._M_str = (char *)wasm;
  name.str._M_len = DAT_00e64520;
  memorySizeFunc = ast;
  local_40 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_SIZE,name);
  pRVar4 = cashew::Ref::operator[](&local_40,3);
  this_00 = pRVar4->inst;
  name_00.str._M_str = extraout_RDX;
  name_00.str._M_len = DAT_00e64390;
  RVar5 = cashew::ValueBuilder::makeName(BUFFER,name_00);
  IString::IString(&local_50,"byteLength");
  key.str._M_str = in_RCX;
  key.str._M_len = (size_t)local_50.str._M_str;
  this_01 = cashew::ValueBuilder::makeDot(RVar5.inst,(Ref)local_50.str._M_len,key);
  sVar3 = DAT_00e64a70;
  RVar5.inst = cashew::DIV.inst;
  RVar6 = cashew::ValueBuilder::makeDouble(65536.0);
  ast_00 = memorySizeFunc;
  op.str._M_str = (char *)RVar6.inst;
  op.str._M_len = sVar3;
  RVar5 = cashew::ValueBuilder::makeBinary(this_01.inst,RVar5,op,in_R8);
  RVar5 = makeJsCoercion(RVar5,JS_INT);
  RVar5 = cashew::ValueBuilder::makeReturn(RVar5);
  cashew::Value::push_back(this_00,RVar5);
  RVar5 = ast_00;
  cashew::Value::push_back(ast_00.inst,local_40);
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar1 != (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (pMVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
     (pMVar2->initial).addr < (pMVar2->max).addr)) {
    addMemoryGrowFunc((Wasm2JSBuilder *)RVar5.inst,ast_00,wasm);
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryFuncs(Ref ast, Module* wasm) {
  Ref memorySizeFunc = ValueBuilder::makeFunction(WASM_MEMORY_SIZE);
  memorySizeFunc[3]->push_back(ValueBuilder::makeReturn(
    makeJsCoercion(ValueBuilder::makeBinary(
                     ValueBuilder::makeDot(ValueBuilder::makeName(BUFFER),
                                           IString("byteLength")),
                     DIV,
                     ValueBuilder::makeInt(Memory::kPageSize)),
                   JsType::JS_INT)));
  ast->push_back(memorySizeFunc);

  if (!wasm->memories.empty() &&
      wasm->memories[0]->max > wasm->memories[0]->initial) {
    addMemoryGrowFunc(ast, wasm);
  }
}